

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O2

int skynet_sendname(skynet_context *context,uint32_t source,char *addr,int type,int session,
                   void *data,size_t sz)

{
  size_t sz_00;
  uint32_t destination;
  int iVar1;
  ulong uVar2;
  remote_message *rmsg;
  long lVar3;
  int session_local;
  void *data_local;
  
  sz_00 = sz;
  if (source == 0) {
    source = context->handle;
  }
  session_local = session;
  data_local = data;
  if (*addr == '.') {
    destination = skynet_handle_findname(addr + 1);
    if (destination == 0) {
      if (((uint)type >> 0x10 & 1) == 0) {
        return -1;
      }
      free(data);
      return -1;
    }
  }
  else {
    if (*addr != ':') {
      _filter_args(context,type,&session_local,&data_local,&sz);
      rmsg = (remote_message *)malloc(0x28);
      iVar1 = session_local;
      for (lVar3 = 0; (lVar3 != 0x10 && (addr[lVar3] != '\0')); lVar3 = lVar3 + 1) {
        (rmsg->destination).name[lVar3] = addr[lVar3];
      }
      for (; lVar3 != 0x10; lVar3 = lVar3 + 1) {
        (rmsg->destination).name[lVar3] = '\0';
      }
      (rmsg->destination).handle = 0;
      rmsg->message = data_local;
      rmsg->sz = sz;
      skynet_harbor_send(rmsg,source,session_local);
      return iVar1;
    }
    uVar2 = strtoul(addr + 1,(char **)0x0,0x10);
    destination = (uint32_t)uVar2;
  }
  iVar1 = skynet_send(context,source,destination,type,session,data,sz_00);
  return iVar1;
}

Assistant:

int
skynet_sendname(struct skynet_context * context, uint32_t source, const char * addr , int type, int session, void * data, size_t sz) {
	if (source == 0) {
		source = context->handle;
	}
	uint32_t des = 0;
	if (addr[0] == ':') {
		des = strtoul(addr+1, NULL, 16);
	} else if (addr[0] == '.') {
		des = skynet_handle_findname(addr + 1);
		if (des == 0) {
			if (type & PTYPE_TAG_DONTCOPY) {
				skynet_free(data);
			}
			return -1;
		}
	} else {
		_filter_args(context, type, &session, (void **)&data, &sz);

		struct remote_message * rmsg = skynet_malloc(sizeof(*rmsg));
		copy_name(rmsg->destination.name, addr);
		rmsg->destination.handle = 0;
		rmsg->message = data;
		rmsg->sz = sz;

		skynet_harbor_send(rmsg, source, session);
		return session;
	}

	return skynet_send(context, source, des, type, session, data, sz);
}